

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

void rd_3dim(char **content,size_t *line_no,int *array,int *dim,int *shift)

{
  int post [3];
  int local_10 [4];
  
  local_10[2] = 0;
  local_10[0] = 0;
  local_10[1] = 0;
  rd_3dim_slice(content,line_no,array,mismatch_dim,mismatch_shift,local_10);
  return;
}

Assistant:

PRIVATE void
rd_3dim(char    **content,
        size_t  *line_no,
        int     *array,
        int     dim[3],
        int     shift[3])
{
  int post[3] = {
    0, 0, 0
  };

  rd_3dim_slice(content, line_no, array,
                dim,
                shift,
                post);
}